

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void windowAggFinal(WindowCodeArg *p,int bFin)

{
  Window *pWVar1;
  int iVar2;
  Vdbe *p_00;
  Window *pWStack_38;
  int nArg;
  Window *pWin;
  Vdbe *v;
  Window *pMWin;
  Parse *pParse;
  int bFin_local;
  WindowCodeArg *p_local;
  
  pWVar1 = p->pMWin;
  p_00 = sqlite3GetVdbe(p->pParse);
  for (pWStack_38 = pWVar1; pWStack_38 != (Window *)0x0; pWStack_38 = pWStack_38->pNextWin) {
    if (((pWVar1->regStartRowid == 0) && ((pWStack_38->pFunc->funcFlags & 0x1000) != 0)) &&
       (pWStack_38->eStart != 'W')) {
      sqlite3VdbeAddOp2(p_00,0x49,0,pWStack_38->regResult);
      sqlite3VdbeAddOp1(p_00,0x20,pWStack_38->csrApp);
      sqlite3VdbeAddOp3(p_00,0x5a,pWStack_38->csrApp,0,pWStack_38->regResult);
      iVar2 = sqlite3VdbeCurrentAddr(p_00);
      sqlite3VdbeJumpHere(p_00,iVar2 + -2);
    }
    else if (pWStack_38->regApp == 0) {
      iVar2 = windowArgCount(pWStack_38);
      if (bFin == 0) {
        sqlite3VdbeAddOp3(p_00,0x9c,pWStack_38->regAccum,iVar2,pWStack_38->regResult);
        sqlite3VdbeAppendP4(p_00,pWStack_38->pFunc,-8);
      }
      else {
        sqlite3VdbeAddOp2(p_00,0x9d,pWStack_38->regAccum,iVar2);
        sqlite3VdbeAppendP4(p_00,pWStack_38->pFunc,-8);
        sqlite3VdbeAddOp2(p_00,0x4e,pWStack_38->regAccum,pWStack_38->regResult);
        sqlite3VdbeAddOp2(p_00,0x49,0,pWStack_38->regAccum);
      }
    }
  }
  return;
}

Assistant:

static void windowAggFinal(WindowCodeArg *p, int bFin){
  Parse *pParse = p->pParse;
  Window *pMWin = p->pMWin;
  Vdbe *v = sqlite3GetVdbe(pParse);
  Window *pWin;

  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    if( pMWin->regStartRowid==0
     && (pWin->pFunc->funcFlags & SQLITE_FUNC_MINMAX) 
     && (pWin->eStart!=TK_UNBOUNDED)
    ){
      sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);
      sqlite3VdbeAddOp1(v, OP_Last, pWin->csrApp);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_Column, pWin->csrApp, 0, pWin->regResult);
      sqlite3VdbeJumpHere(v, sqlite3VdbeCurrentAddr(v)-2);
    }else if( pWin->regApp ){
      assert( pMWin->regStartRowid==0 );
    }else{
      int nArg = windowArgCount(pWin);
      if( bFin ){
        sqlite3VdbeAddOp2(v, OP_AggFinal, pWin->regAccum, nArg);
        sqlite3VdbeAppendP4(v, pWin->pFunc, P4_FUNCDEF);
        sqlite3VdbeAddOp2(v, OP_Copy, pWin->regAccum, pWin->regResult);
        sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regAccum);
      }else{
        sqlite3VdbeAddOp3(v, OP_AggValue,pWin->regAccum,nArg,pWin->regResult);
        sqlite3VdbeAppendP4(v, pWin->pFunc, P4_FUNCDEF);
      }
    }
  }
}